

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Vector<kj::Url::QueryParam>::~Vector(Vector<kj::Url::QueryParam> *this)

{
  QueryParam *pQVar1;
  RemoveConst<kj::Url::QueryParam> *pRVar2;
  QueryParam *pQVar3;
  ArrayDisposer *pAVar4;
  
  pQVar1 = (this->builder).ptr;
  if (pQVar1 != (QueryParam *)0x0) {
    pRVar2 = (this->builder).pos;
    pQVar3 = (this->builder).endPtr;
    (this->builder).ptr = (QueryParam *)0x0;
    (this->builder).pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
    (this->builder).endPtr = (QueryParam *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pQVar1,0x30,((long)pRVar2 - (long)pQVar1 >> 4) * -0x5555555555555555,
               ((long)pQVar3 - (long)pQVar1 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Url::QueryParam>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }